

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O1

void __thiscall
embree::avx::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::splitFallback
          (UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set,
          PrimInfoRange *lset,PrimInfoRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar6;
  long lVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar3 = set->_begin;
  uVar4 = set->_end;
  uVar5 = uVar4 + uVar3 >> 1;
  aVar8.m128[2] = INFINITY;
  aVar8._0_8_ = 0x7f8000007f800000;
  aVar8.m128[3] = INFINITY;
  aVar9.m128[2] = -INFINITY;
  aVar9._0_8_ = 0xff800000ff800000;
  aVar9.m128[3] = -INFINITY;
  lVar7 = uVar5 - uVar3;
  aVar12 = aVar8;
  aVar10 = aVar9;
  aVar11 = aVar9;
  aVar13 = aVar8;
  if (uVar3 <= uVar5 && lVar7 != 0) {
    paVar6 = &this->prims[uVar3].upper.field_0;
    aVar10.m128[2] = -INFINITY;
    aVar10._0_8_ = 0xff800000ff800000;
    aVar10.m128[3] = -INFINITY;
    aVar12.m128[2] = INFINITY;
    aVar12._0_8_ = 0x7f8000007f800000;
    aVar12.m128[3] = INFINITY;
    aVar11 = aVar10;
    aVar13 = aVar12;
    do {
      aVar1 = paVar6[-1].field_1;
      aVar2 = paVar6->field_1;
      aVar12.m128 = (__m128)vminps_avx(aVar12.m128,(undefined1  [16])aVar1);
      aVar10.m128 = (__m128)vmaxps_avx(aVar10.m128,(undefined1  [16])aVar2);
      auVar15._0_4_ = aVar1.x + aVar2.x;
      auVar15._4_4_ = aVar1.y + aVar2.y;
      auVar15._8_4_ = aVar1.z + aVar2.z;
      auVar15._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      aVar13.m128 = (__m128)vminps_avx(aVar13.m128,auVar15);
      aVar11.m128 = (__m128)vmaxps_avx(aVar11.m128,auVar15);
      paVar6 = paVar6 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar12;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar10;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar13;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar11;
  (lset->super_range<unsigned_long>)._begin = uVar3;
  (lset->super_range<unsigned_long>)._end = uVar5;
  lVar7 = uVar4 - uVar5;
  aVar13 = aVar8;
  aVar11 = aVar9;
  if (uVar5 <= uVar4 && lVar7 != 0) {
    paVar6 = &this->prims[uVar5].upper.field_0;
    aVar11.m128[2] = -INFINITY;
    aVar11._0_8_ = 0xff800000ff800000;
    aVar11.m128[3] = -INFINITY;
    aVar13.m128[2] = INFINITY;
    aVar13._0_8_ = 0x7f8000007f800000;
    aVar13.m128[3] = INFINITY;
    aVar9 = aVar11;
    aVar8 = aVar13;
    do {
      aVar1 = paVar6[-1].field_1;
      aVar2 = paVar6->field_1;
      aVar8.m128 = (__m128)vminps_avx(aVar8.m128,(undefined1  [16])aVar1);
      aVar9.m128 = (__m128)vmaxps_avx(aVar9.m128,(undefined1  [16])aVar2);
      auVar14._0_4_ = aVar1.x + aVar2.x;
      auVar14._4_4_ = aVar1.y + aVar2.y;
      auVar14._8_4_ = aVar1.z + aVar2.z;
      auVar14._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      aVar13.m128 = (__m128)vminps_avx(aVar13.m128,auVar14);
      aVar11.m128 = (__m128)vmaxps_avx(aVar11.m128,auVar14);
      paVar6 = paVar6 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar8;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar9;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar13;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar11;
  (rset->super_range<unsigned_long>)._begin = uVar5;
  (rset->super_range<unsigned_long>)._end = uVar4;
  return;
}

Assistant:

__forceinline Ty begin() const {
        return _begin;
      }